

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O3

void collect_jobs(pmtr_t *cfg,UT_string *sm)

{
  ulong uVar1;
  code *pcVar2;
  job_t *pjVar3;
  uint uVar4;
  __pid_t __pid;
  pid_t pVar5;
  undefined8 in_RAX;
  job_t *pjVar6;
  time_t tVar7;
  ulong uVar8;
  long lVar9;
  UT_array *pUVar10;
  ulong uVar11;
  int es;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  uVar4 = waitpid(-1,(int *)((long)&uStack_38 + 4),1);
  if (0 < (int)uVar4) {
    do {
      if (uVar4 == cfg->dm_pid) {
        if ((uStack_38._4_4_ & 0xff7f) == 0x2100) {
          pVar5 = 0;
          syslog(6,"inotify-based dependency monitoring disabled");
        }
        else {
          pVar5 = dep_monitor(cfg->file);
        }
        cfg->dm_pid = pVar5;
      }
      else if (uVar4 == cfg->logger_pid) {
        __pid = getpid();
        kill(__pid,0xf);
      }
      else {
        pjVar6 = get_job_by_pid(cfg->jobs,uVar4);
        if (pjVar6 == (job_t *)0x0) {
          syslog(3,"sigchld for unknown pid %d",(ulong)uVar4);
        }
        else {
          pjVar6->pid = 0;
          pjVar6->terminate = 0;
          tVar7 = time((time_t *)0x0);
          lVar9 = tVar7 + 10;
          if (9 < (int)tVar7 - (int)pjVar6->start_ts) {
            lVar9 = tVar7;
          }
          pjVar6->start_at = lVar9;
          if (pjVar6->once != 0) {
            pjVar6->respawn = 0;
          }
          sm->i = 0;
          *sm->d = '\0';
          utstring_printf(sm,"job %s [%d] exited after %d sec: ",pjVar6->name,(ulong)uVar4);
          if (0x1ffffff < (int)((uStack_38._4_4_ & 0x7f) * 0x1000000 + 0x1000000)) {
            utstring_printf(sm,"signal %d");
          }
          if ((uStack_38._4_4_ & 0x7f) == 0) {
            uVar4 = uStack_38._4_4_ >> 8 & 0xff;
            uVar8 = (ulong)uVar4;
            if (uVar4 == 0x21) {
              pjVar6->respawn = 0;
              uVar8 = 0x21;
            }
            utstring_printf(sm,"exit status %d",uVar8);
          }
          syslog(6,"%s",sm->d);
          if (pjVar6->delete_when_collected != 0) {
            pUVar10 = cfg->jobs;
            pcVar2 = (code *)(pUVar10->icd).dtor;
            if (pcVar2 != (code *)0x0) {
              pjVar3 = (job_t *)pUVar10->d;
              uVar8 = (long)pjVar6 - (long)pjVar3;
              if (pjVar6 < pjVar3) {
                lVar9 = 0;
              }
              else {
                uVar1 = (pUVar10->icd).sz;
                lVar9 = 0;
                if (uVar8 / uVar1 < (ulong)pUVar10->i) {
                  lVar9 = (long)pjVar3 + (uVar8 - uVar8 % uVar1);
                }
              }
              (*pcVar2)(lVar9);
              pUVar10 = cfg->jobs;
            }
            uVar4 = pUVar10->i;
            pjVar3 = (job_t *)pUVar10->d;
            uVar8 = (long)pjVar6 - (long)pjVar3;
            if (pjVar6 < pjVar3) {
              if (uVar4 == 0) {
                uVar4 = 0;
              }
              else {
                uVar11 = (pUVar10->icd).sz;
                lVar9 = -uVar11;
                uVar8 = 0;
                pjVar6 = pjVar3;
LAB_00105cb9:
                memmove((void *)((long)&pjVar3->name + lVar9),pjVar6,(uVar8 + uVar4) * uVar11);
                pUVar10 = cfg->jobs;
                uVar4 = pUVar10->i;
              }
            }
            else {
              uVar11 = (pUVar10->icd).sz;
              uVar1 = uVar8 / uVar11 + 1;
              if (uVar1 < uVar4) {
                lVar9 = uVar8 - uVar8 % uVar11;
                pjVar6 = (job_t *)((long)&pjVar3->name + uVar1 * uVar11);
                uVar8 = ~(uVar8 / uVar11);
                goto LAB_00105cb9;
              }
            }
            pUVar10->i = uVar4 - 1;
          }
        }
      }
      uVar4 = waitpid(-1,(int *)((long)&uStack_38 + 4),1);
    } while (0 < (int)uVar4);
  }
  return;
}

Assistant:

void collect_jobs(pmtr_t *cfg, UT_string *sm) {
  int es, ex, elapsed;
  time_t now;
  job_t *job;
  pid_t pid;

  while ( (pid = waitpid(-1, &es, WNOHANG)) > 0) {

    /* respawn if it's our dependency monitor, unless its flagged */
    if (pid==cfg->dm_pid) { 
      if (WIFEXITED(es) && ((WEXITSTATUS(es)) == PMTR_NO_RESTART)) {
        syslog(LOG_INFO, "inotify-based dependency monitoring disabled");
        cfg->dm_pid = 0;
      } else {
        cfg->dm_pid = dep_monitor(cfg->file);
      }
      continue;
    }
    /* if it's our logger sub process ... */
    if (pid==cfg->logger_pid) { 
      kill(getpid(), 15); /* induce graceful shutdown in main loop */
      continue;
    }
    /* find the job.  we should always find it by pid. */
    job = get_job_by_pid(cfg->jobs, pid);
    if (!job) {
      syslog(LOG_ERR,"sigchld for unknown pid %d",(int)pid); 
      continue;
    }
    /* decide if and when it should be restarted */
    job->pid = 0;
    job->terminate = 0; /* any termination request has succeeded */
    now = time(NULL);
    elapsed = now - job->start_ts;
    job->start_at = (elapsed < SHORT_DELAY) ? (now+SHORT_DELAY) : now;
    if (job->once) job->respawn=0;

    /* write a log message about how the job exited */
    utstring_clear(sm);
    utstring_printf(sm,"job %s [%d] exited after %d sec: ", job->name, 
      (int)pid, elapsed);
    if (WIFSIGNALED(es)) utstring_printf(sm, "signal %d", (int)WTERMSIG(es));
    if (WIFEXITED(es)) {
      if ( (ex = WEXITSTATUS(es)) == PMTR_NO_RESTART) job->respawn=0;
      utstring_printf(sm,"exit status %d", ex);
    }
    syslog(LOG_INFO,"%s",utstring_body(sm));

    /* is this a former job that was deleted from the config file? */
    if (job->delete_when_collected) {
      utarray_erase(cfg->jobs, utarray_eltidx(cfg->jobs,job), 1);
      job=NULL;
    }
  }
}